

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O1

void __thiscall CMapLayers::LoadBackgroundMap(CMapLayers *this)

{
  IConsole *pIVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  CMapImages *this_00;
  char *pcVar5;
  char *a;
  char *pcVar6;
  long in_FS_OFFSET;
  char aBuf [128];
  char acStack_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  a = ((this->super_CComponent).m_pClient)->m_pConfig->m_ClMenuMap;
  iVar2 = str_comp(a,"auto");
  if (iVar2 == 0) {
    uVar3 = time_season();
    if (uVar3 < 4) {
      a = &DAT_001dc150 + *(int *)(&DAT_001dc150 + (ulong)uVar3 * 4);
    }
  }
  iVar2 = time_houroftheday();
  pcVar6 = "day";
  pcVar5 = "night";
  if (iVar2 - 6U < 0xc) {
    pcVar5 = "day";
  }
  str_format(acStack_b8,0x80,"ui/themes/%s_%s.map",a,pcVar5);
  iVar4 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[9])
                    (this->m_pMenuMap,acStack_b8,((this->super_CComponent).m_pClient)->m_pStorage);
  if ((char)iVar4 == '\0') {
    str_format(acStack_b8,0x80,"ui/themes/%s.map",a);
    iVar4 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[9])
                      (this->m_pMenuMap,acStack_b8,((this->super_CComponent).m_pClient)->m_pStorage)
    ;
    if ((char)iVar4 == '\0') {
      if (iVar2 - 6U < 0xc) {
        pcVar6 = "night";
      }
      str_format(acStack_b8,0x80,"ui/themes/%s_%s.map",a,pcVar6);
      iVar2 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[9])
                        (this->m_pMenuMap,acStack_b8,
                         ((this->super_CComponent).m_pClient)->m_pStorage);
      if ((char)iVar2 == '\0') {
        str_format(acStack_b8,0x80,"map \'%s\' not found",a);
        pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
        (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,1,"client",acStack_b8,0);
        goto LAB_0014c1ce;
      }
    }
  }
  str_format(acStack_b8,0x80,"loaded map \'%s\'",a);
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,1,"client",acStack_b8,0);
  CLayers::Init(this->m_pMenuLayers,
                (((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface.m_pKernel
                ,&this->m_pMenuMap->super_IMap);
  this_00 = ((this->super_CComponent).m_pClient)->m_pMapimages;
  CMapImages::OnMenuMapLoad(this_00,&this->m_pMenuMap->super_IMap);
  LoadEnvPoints((CMapLayers *)this_00,this->m_pMenuLayers,&this->m_lEnvPointsMenu);
LAB_0014c1ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMapLayers::LoadBackgroundMap()
{
	const char *pMenuMap = Config()->m_ClMenuMap;
	if(str_comp(pMenuMap, "auto") == 0)
	{
		switch(time_season())
		{
			case SEASON_SPRING:
				pMenuMap = "heavens";
				break;
			case SEASON_SUMMER:
				pMenuMap = "jungle";
				break;
			case SEASON_AUTUMN:
				pMenuMap = "autumn";
				break;
			case SEASON_WINTER:
				pMenuMap = "winter";
				break;
		}
	}

	const int HourOfTheDay = time_houroftheday();
	const bool IsDaytime = HourOfTheDay >= 6 && HourOfTheDay < 18;

	char aBuf[128];
	// check for the appropriate day/night map
	str_format(aBuf, sizeof(aBuf), "ui/themes/%s_%s.map", pMenuMap, IsDaytime ? "day" : "night");
	if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
	{
		// fall back on generic map
		str_format(aBuf, sizeof(aBuf), "ui/themes/%s.map", pMenuMap);
		if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
		{
			// fall back on day/night alternative map
			str_format(aBuf, sizeof(aBuf), "ui/themes/%s_%s.map", pMenuMap, IsDaytime ? "night" : "day");
			if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
			{
				str_format(aBuf, sizeof(aBuf), "map '%s' not found", pMenuMap);
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
				return;
			}
		}
	}

	str_format(aBuf, sizeof(aBuf), "loaded map '%s'", pMenuMap);
	Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);

	m_pMenuLayers->Init(Kernel(), m_pMenuMap);
	m_pClient->m_pMapimages->OnMenuMapLoad(m_pMenuMap);
	LoadEnvPoints(m_pMenuLayers, m_lEnvPointsMenu);
}